

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::eof_matcher<pstore::exchange::import_ns::callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,eof_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  error_code local_28;
  
  if (ch->valid_ == true) {
    local_28._M_cat = get_error_category();
    local_28._M_value = 0xc;
    matcher<pstore::exchange::import_ns::callbacks>::set_error
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser,&local_28);
  }
  else {
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            eof_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> const ch) {
                if (ch) {
                    this->set_error (parser, error_code::unexpected_extra_input);
                } else {
                    this->set_state (done_state);
                }
                return {nullptr, true};
            }